

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ShouldShard
               (char *total_shards_env,char *shard_index_env,bool in_subprocess_for_death_test)

{
  Message *pMVar1;
  char *pcVar2;
  string local_d0;
  Message local_b0;
  Message local_a8;
  Message msg_2;
  Message local_80;
  Message local_78;
  Message msg_1;
  Message local_40;
  Message local_38;
  Message msg;
  int local_28;
  Int32 shard_index;
  Int32 total_shards;
  bool in_subprocess_for_death_test_local;
  char *shard_index_env_local;
  char *total_shards_env_local;
  
  if (in_subprocess_for_death_test) {
    total_shards_env_local._7_1_ = false;
  }
  else {
    shard_index._3_1_ = in_subprocess_for_death_test;
    _total_shards = shard_index_env;
    shard_index_env_local = total_shards_env;
    local_28 = Int32FromEnvOrDie(total_shards_env,-1);
    msg.ss_.ptr_._4_4_ = Int32FromEnvOrDie(_total_shards,-1);
    if ((local_28 == -1) && (msg.ss_.ptr_._4_4_ == -1)) {
      total_shards_env_local._7_1_ = false;
    }
    else {
      if ((local_28 == -1) && (msg.ss_.ptr_._4_4_ != -1)) {
        Message::Message(&local_40);
        pMVar1 = Message::operator<<(&local_40,
                                     (char (*) [41])"Invalid environment variables: you have ");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [18])"GTEST_SHARD_INDEX");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [4])0x15af1c);
        pMVar1 = Message::operator<<(pMVar1,(int *)((long)&msg.ss_.ptr_ + 4));
        pMVar1 = Message::operator<<(pMVar1,(char (*) [17])", but have left ");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [19])"GTEST_TOTAL_SHARDS");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [9])" unset.\n");
        Message::Message(&local_38,pMVar1);
        Message::~Message(&local_40);
        Message::GetString_abi_cxx11_((string *)&msg_1,&local_38);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        ColoredPrintf(COLOR_RED,pcVar2);
        std::__cxx11::string::~string((string *)&msg_1);
        fflush(_stdout);
        exit(1);
      }
      if ((local_28 != -1) && (msg.ss_.ptr_._4_4_ == -1)) {
        Message::Message(&local_80);
        pMVar1 = Message::operator<<(&local_80,
                                     (char (*) [41])"Invalid environment variables: you have ");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [19])"GTEST_TOTAL_SHARDS");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [4])0x15af1c);
        pMVar1 = Message::operator<<(pMVar1,&local_28);
        pMVar1 = Message::operator<<(pMVar1,(char (*) [17])", but have left ");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [18])"GTEST_SHARD_INDEX");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [9])" unset.\n");
        Message::Message(&local_78,pMVar1);
        Message::~Message(&local_80);
        Message::GetString_abi_cxx11_((string *)&msg_2,&local_78);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        ColoredPrintf(COLOR_RED,pcVar2);
        std::__cxx11::string::~string((string *)&msg_2);
        fflush(_stdout);
        exit(1);
      }
      if ((msg.ss_.ptr_._4_4_ < 0) || (local_28 <= msg.ss_.ptr_._4_4_)) {
        Message::Message(&local_b0);
        pMVar1 = Message::operator<<(&local_b0,
                                     (char (*) [48])
                                     "Invalid environment variables: we require 0 <= ");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [18])"GTEST_SHARD_INDEX");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [4])" < ");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [19])"GTEST_TOTAL_SHARDS");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [16])", but you have ");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [18])"GTEST_SHARD_INDEX");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [2])0x15bac9);
        pMVar1 = Message::operator<<(pMVar1,(int *)((long)&msg.ss_.ptr_ + 4));
        pMVar1 = Message::operator<<(pMVar1,(char (*) [3])0x15bf78);
        pMVar1 = Message::operator<<(pMVar1,(char (*) [19])"GTEST_TOTAL_SHARDS");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [2])0x15bac9);
        pMVar1 = Message::operator<<(pMVar1,&local_28);
        pMVar1 = Message::operator<<(pMVar1,(char (*) [3])0x15a8aa);
        Message::Message(&local_a8,pMVar1);
        Message::~Message(&local_b0);
        Message::GetString_abi_cxx11_(&local_d0,&local_a8);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        ColoredPrintf(COLOR_RED,pcVar2);
        std::__cxx11::string::~string((string *)&local_d0);
        fflush(_stdout);
        exit(1);
      }
      total_shards_env_local._7_1_ = 1 < local_28;
    }
  }
  return total_shards_env_local._7_1_;
}

Assistant:

bool ShouldShard(const char* total_shards_env,
                 const char* shard_index_env,
                 bool in_subprocess_for_death_test) {
  if (in_subprocess_for_death_test) {
    return false;
  }

  const Int32 total_shards = Int32FromEnvOrDie(total_shards_env, -1);
  const Int32 shard_index = Int32FromEnvOrDie(shard_index_env, -1);

  if (total_shards == -1 && shard_index == -1) {
    return false;
  } else if (total_shards == -1 && shard_index != -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestShardIndex << " = " << shard_index
      << ", but have left " << kTestTotalShards << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (total_shards != -1 && shard_index == -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestTotalShards << " = " << total_shards
      << ", but have left " << kTestShardIndex << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (shard_index < 0 || shard_index >= total_shards) {
    const Message msg = Message()
      << "Invalid environment variables: we require 0 <= "
      << kTestShardIndex << " < " << kTestTotalShards
      << ", but you have " << kTestShardIndex << "=" << shard_index
      << ", " << kTestTotalShards << "=" << total_shards << ".\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  }

  return total_shards > 1;
}